

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddIsop.c
# Opt level: O0

DdNode * cuddMakeBddFromZddCover(DdManager *dd,DdNode *node)

{
  int iVar1;
  DdNode *n;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *local_70;
  DdNode *E;
  DdNode *T;
  DdNode *bd;
  DdNode *b0;
  DdNode *b1;
  DdNode *fd;
  DdNode *f0;
  DdNode *f1;
  DdManager *pDStack_28;
  int v;
  DdNode *neW;
  DdNode *node_local;
  DdManager *dd_local;
  
  if (node == dd->one) {
    dd_local = (DdManager *)dd->one;
  }
  else if (node == dd->zero) {
    dd_local = (DdManager *)((ulong)dd->one ^ 1);
  }
  else {
    neW = node;
    node_local = &dd->sentinel;
    pDStack_28 = (DdManager *)cuddCacheLookup1(dd,cuddMakeBddFromZddCover,node);
    dd_local = pDStack_28;
    if (pDStack_28 == (DdManager *)0x0) {
      f1._4_4_ = *(int *)((ulong)neW & 0xfffffffffffffffe);
      iVar1 = cuddZddGetCofactors3((DdManager *)node_local,neW,f1._4_4_,&f0,&fd,&b1);
      if (iVar1 == 0) {
        Cudd_Ref(f0);
        Cudd_Ref(fd);
        Cudd_Ref(b1);
        E = cuddMakeBddFromZddCover((DdManager *)node_local,f0);
        if (E == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd((DdManager *)node_local,f0);
          Cudd_RecursiveDerefZdd((DdManager *)node_local,fd);
          Cudd_RecursiveDerefZdd((DdManager *)node_local,b1);
          dd_local = (DdManager *)0x0;
        }
        else {
          Cudd_Ref(E);
          local_70 = cuddMakeBddFromZddCover((DdManager *)node_local,fd);
          if (local_70 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd((DdManager *)node_local,f0);
            Cudd_RecursiveDerefZdd((DdManager *)node_local,fd);
            Cudd_RecursiveDerefZdd((DdManager *)node_local,b1);
            Cudd_RecursiveDeref((DdManager *)node_local,E);
            dd_local = (DdManager *)0x0;
          }
          else {
            Cudd_Ref(local_70);
            Cudd_RecursiveDerefZdd((DdManager *)node_local,f0);
            Cudd_RecursiveDerefZdd((DdManager *)node_local,fd);
            if (b1 == node_local[1].next) {
              Cudd_RecursiveDerefZdd((DdManager *)node_local,b1);
            }
            else {
              n = cuddMakeBddFromZddCover((DdManager *)node_local,b1);
              if (n == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd((DdManager *)node_local,b1);
                Cudd_RecursiveDeref((DdManager *)node_local,E);
                Cudd_RecursiveDeref((DdManager *)node_local,local_70);
                return (DdNode *)0x0;
              }
              Cudd_Ref(n);
              Cudd_RecursiveDerefZdd((DdManager *)node_local,b1);
              pDVar2 = cuddBddAndRecur((DdManager *)node_local,(DdNode *)((ulong)E ^ 1),
                                       (DdNode *)((ulong)n ^ 1));
              if (pDVar2 == (DdNode *)0x0) {
                Cudd_RecursiveDeref((DdManager *)node_local,E);
                Cudd_RecursiveDeref((DdManager *)node_local,local_70);
                Cudd_RecursiveDeref((DdManager *)node_local,n);
                return (DdNode *)0x0;
              }
              pDVar2 = (DdNode *)((ulong)pDVar2 ^ (long)(int)(uint)(pDVar2 != (DdNode *)0x0));
              Cudd_Ref(pDVar2);
              Cudd_RecursiveDeref((DdManager *)node_local,E);
              pDVar3 = cuddBddAndRecur((DdManager *)node_local,(DdNode *)((ulong)local_70 ^ 1),
                                       (DdNode *)((ulong)n ^ 1));
              if (pDVar3 == (DdNode *)0x0) {
                Cudd_RecursiveDeref((DdManager *)node_local,local_70);
                Cudd_RecursiveDeref((DdManager *)node_local,n);
                Cudd_RecursiveDeref((DdManager *)node_local,pDVar2);
                return (DdNode *)0x0;
              }
              pDVar3 = (DdNode *)((ulong)pDVar3 ^ (long)(int)(uint)(pDVar3 != (DdNode *)0x0));
              Cudd_Ref(pDVar3);
              Cudd_RecursiveDeref((DdManager *)node_local,local_70);
              Cudd_RecursiveDeref((DdManager *)node_local,n);
              local_70 = pDVar3;
              E = pDVar2;
            }
            if (((ulong)E & 1) == 0) {
              pDStack_28 = (DdManager *)
                           cuddUniqueInterIVO((DdManager *)node_local,f1._4_4_ / 2,E,local_70);
              if (pDStack_28 == (DdManager *)0x0) {
                Cudd_RecursiveDeref((DdManager *)node_local,E);
                Cudd_RecursiveDeref((DdManager *)node_local,local_70);
                return (DdNode *)0x0;
              }
            }
            else {
              pDStack_28 = (DdManager *)
                           cuddUniqueInterIVO((DdManager *)node_local,f1._4_4_ / 2,
                                              (DdNode *)((ulong)E ^ 1),
                                              (DdNode *)((ulong)local_70 ^ 1));
              if (pDStack_28 == (DdManager *)0x0) {
                Cudd_RecursiveDeref((DdManager *)node_local,E);
                Cudd_RecursiveDeref((DdManager *)node_local,local_70);
                return (DdNode *)0x0;
              }
              pDStack_28 = (DdManager *)((ulong)pDStack_28 ^ 1);
            }
            Cudd_Ref(&pDStack_28->sentinel);
            Cudd_RecursiveDeref((DdManager *)node_local,E);
            Cudd_RecursiveDeref((DdManager *)node_local,local_70);
            cuddCacheInsert1((DdManager *)node_local,cuddMakeBddFromZddCover,neW,
                             &pDStack_28->sentinel);
            Cudd_Deref(&pDStack_28->sentinel);
            dd_local = pDStack_28;
          }
        }
      }
      else {
        dd_local = (DdManager *)0x0;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode  *
cuddMakeBddFromZddCover(
  DdManager * dd,
  DdNode * node)
{
    DdNode      *neW;
    int         v;
    DdNode      *f1, *f0, *fd;
    DdNode      *b1, *b0, *bd;
    DdNode      *T, *E;

    statLine(dd);
    if (node == dd->one)
        return(dd->one);
    if (node == dd->zero)
        return(Cudd_Not(dd->one));

    /* Check cache */
    neW = cuddCacheLookup1(dd, cuddMakeBddFromZddCover, node);
    if (neW)
        return(neW);

    v = Cudd_Regular(node)->index;      /* either yi or zi */
    if (cuddZddGetCofactors3(dd, node, v, &f1, &f0, &fd)) return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    Cudd_Ref(fd);

    b1 = cuddMakeBddFromZddCover(dd, f1);
    if (!b1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        return(NULL);
    }
    Cudd_Ref(b1);
    b0 = cuddMakeBddFromZddCover(dd, f0);
    if (!b0) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDeref(dd, b1);
        return(NULL);
    }
    Cudd_Ref(b0);
    Cudd_RecursiveDerefZdd(dd, f1);
    Cudd_RecursiveDerefZdd(dd, f0);
    if (fd != dd->zero) {
        bd = cuddMakeBddFromZddCover(dd, fd);
        if (!bd) {
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDeref(dd, b1);
            Cudd_RecursiveDeref(dd, b0);
            return(NULL);
        }
        Cudd_Ref(bd);
        Cudd_RecursiveDerefZdd(dd, fd);

        T = cuddBddAndRecur(dd, Cudd_Not(b1), Cudd_Not(bd));
        if (!T) {
            Cudd_RecursiveDeref(dd, b1);
            Cudd_RecursiveDeref(dd, b0);
            Cudd_RecursiveDeref(dd, bd);
            return(NULL);
        }
        T = Cudd_NotCond(T, T != NULL);
        Cudd_Ref(T);
        Cudd_RecursiveDeref(dd, b1);
        E = cuddBddAndRecur(dd, Cudd_Not(b0), Cudd_Not(bd));
        if (!E) {
            Cudd_RecursiveDeref(dd, b0);
            Cudd_RecursiveDeref(dd, bd);
            Cudd_RecursiveDeref(dd, T);
            return(NULL);
        }
        E = Cudd_NotCond(E, E != NULL);
        Cudd_Ref(E);
        Cudd_RecursiveDeref(dd, b0);
        Cudd_RecursiveDeref(dd, bd);
    }
    else {
        Cudd_RecursiveDerefZdd(dd, fd);
        T = b1;
        E = b0;
    }

    if (Cudd_IsComplement(T)) {
        neW = cuddUniqueInterIVO(dd, v / 2, Cudd_Not(T), Cudd_Not(E));
        if (!neW) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
        neW = Cudd_Not(neW);
    }
    else {
        neW = cuddUniqueInterIVO(dd, v / 2, T, E);
        if (!neW) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
    }
    Cudd_Ref(neW);
    Cudd_RecursiveDeref(dd, T);
    Cudd_RecursiveDeref(dd, E);

    cuddCacheInsert1(dd, cuddMakeBddFromZddCover, node, neW);
    Cudd_Deref(neW);
    return(neW);

}